

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

void __thiscall
flatbuffers::JsonPrinter::GenField<signed_char>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  Table val;
  ushort uVar1;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,fixed) == 0) {
    if (fd->presence == kOptional) {
      uVar1 = (fd->value).offset;
      if (uVar1 < *(ushort *)(table + -(long)*(int *)table)) {
        uVar1 = *(ushort *)(table + ((ulong)uVar1 - (long)*(int *)table));
      }
      else {
        uVar1 = 0;
      }
      if (uVar1 == 0) {
        std::__cxx11::string::append((char *)this->text);
        return;
      }
      val = table[uVar1];
    }
    else {
      uVar1 = (fd->value).offset;
      val = (Table)GetFieldDefault<signed_char>(fd);
      if (uVar1 < *(ushort *)(table + -(long)*(int *)table)) {
        uVar1 = *(ushort *)(table + ((ulong)uVar1 - (long)*(int *)table));
      }
      else {
        uVar1 = 0;
      }
      if (uVar1 != 0) {
        val = table[uVar1];
      }
    }
  }
  else {
    val = table[(fd->value).offset];
  }
  PrintScalar<signed_char>(this,(char)val,&(fd->value).type,indent);
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }